

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

int Ivy_ManCleanup(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  pVVar3 = p->vObjs;
  iVar4 = iVar2;
  iVar5 = iVar1;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar3->pArray[lVar6];
      if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xc) == 4)) &&
         (pObj->nRefs == 0)) {
        Ivy_ObjDelete_rec(p,pObj,1);
        pVVar3 = p->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
    iVar5 = p->nObjs[5];
    iVar4 = p->nObjs[6];
  }
  return (iVar2 + iVar1) - (iVar4 + iVar5);
}

Assistant:

int Ivy_ManCleanup( Ivy_Man_t * p )
{
    Ivy_Obj_t * pNode;
    int i, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pNode, i )
        if ( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
            if ( Ivy_ObjRefs(pNode) == 0 )
                Ivy_ObjDelete_rec( p, pNode, 1 );
//printf( "Cleanup removed %d nodes.\n", nNodesOld - Ivy_ManNodeNum(p) );
    return nNodesOld - Ivy_ManNodeNum(p);
}